

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O2

void Tim_ManSetCoArrival(Tim_Man_t *p,int iCo,float Delay)

{
  Tim_Obj_t *pTVar1;
  uint __line;
  int iVar2;
  char *__assertion;
  
  if (p->nCos <= iCo) {
    __assertion = "iCo < p->nCos";
    __line = 0x76;
LAB_003e529c:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timTime.c"
                  ,__line,"void Tim_ManSetCoArrival(Tim_Man_t *, int, float)");
  }
  pTVar1 = p->pCos;
  if (p->fUseTravId == 0) {
    iVar2 = p->nTravIds;
  }
  else {
    iVar2 = p->nTravIds;
    if (pTVar1[iCo].TravId == iVar2) {
      __assertion = "!p->fUseTravId || p->pCos[iCo].TravId != p->nTravIds";
      __line = 0x77;
      goto LAB_003e529c;
    }
  }
  pTVar1[iCo].timeArr = Delay;
  pTVar1[iCo].TravId = iVar2;
  return;
}

Assistant:

void Tim_ManSetCoArrival( Tim_Man_t * p, int iCo, float Delay )
{
    assert( iCo < p->nCos );
    assert( !p->fUseTravId || p->pCos[iCo].TravId != p->nTravIds );
    p->pCos[iCo].timeArr = Delay;
    p->pCos[iCo].TravId = p->nTravIds;
}